

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool __thiscall
re2::RE2::Match(RE2 *this,StringPiece *text,size_t startpos,size_t endpos,Anchor re_anchor,
               StringPiece *submatch,int nsubmatch)

{
  byte *pbVar1;
  ostringstream *poVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  Anchor AVar9;
  ostream *poVar10;
  Prog *pPVar11;
  Anchor anchor;
  byte *pbVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  StringPiece *pSVar16;
  ulong uVar17;
  StringPiece *pSVar18;
  Anchor AVar19;
  byte *__s1;
  byte bVar20;
  unsigned_short *puVar21;
  Prog *pPVar22;
  byte *__s2;
  byte bVar23;
  bool dfa_failed;
  Anchor local_21c;
  ulong local_218;
  Prog *local_210;
  ulong local_208;
  unsigned_short *local_200;
  StringPiece *local_1f8;
  StringPiece *local_1f0;
  StringPiece local_1e8;
  StringPiece match;
  StringPiece local_1c8;
  LogMessage local_1b0;
  
  if (this->error_code_ != NoError) {
    if ((this->options_).log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
               ,0x244);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"Invalid RE2: ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,(this->error_->_M_dataplus)._M_p,
               this->error_->_M_string_length);
    goto LAB_001b46fa;
  }
  if (startpos <= endpos) {
    uVar4 = text->size_;
    if (endpos < uVar4 || endpos - uVar4 == 0) {
      __s2 = (byte *)(text->data_ + startpos);
      local_1e8.data_ = (const_pointer)__s2;
      local_1e8.size_ = (text->size_ - startpos) + (endpos - uVar4);
      match.data_ = (const_pointer)0x0;
      match.size_ = 0;
      local_1f8 = (StringPiece *)0x0;
      if (nsubmatch != 0) {
        local_1f8 = &match;
      }
      uVar5 = this->num_captures_ + 1;
      if (nsubmatch <= this->num_captures_) {
        uVar5 = nsubmatch;
      }
      pPVar22 = (Prog *)(ulong)uVar5;
      pPVar11 = this->prog_;
      bVar6 = pPVar11->anchor_start_;
      uVar14 = CONCAT71((int7)(startpos >> 8),startpos != 0);
      if ((startpos != 0 & bVar6) != 0) {
        return false;
      }
      if ((bVar6 == false) || (local_21c = ANCHOR_BOTH, pPVar11->anchor_end_ == false)) {
        local_21c = ANCHOR_START;
        if (bVar6 == false) {
          local_21c = re_anchor;
        }
        if (re_anchor == ANCHOR_BOTH) {
          local_21c = re_anchor;
        }
      }
      local_218 = (this->prefix_)._M_string_length;
      local_1f0 = text;
      if (local_218 == 0) {
        local_218 = 0;
      }
      else {
        if (startpos != 0) {
          return false;
        }
        uVar15 = local_1e8.size_ - local_218;
        if (local_1e8.size_ < local_218) {
          return false;
        }
        __s1 = (byte *)(this->prefix_)._M_dataplus._M_p;
        local_210 = pPVar11;
        if (this->prefix_foldcase_ == true) {
          if (0 < (long)local_218) {
            pbVar1 = __s1 + local_218;
            pbVar12 = __s2;
            do {
              uVar17 = uVar14 & 0xffffffff;
              bVar23 = *__s1;
              bVar3 = *pbVar12;
              bVar20 = bVar3 | 0x20;
              if (0x19 < (byte)(bVar3 + 0xbf)) {
                bVar20 = bVar3;
              }
              uVar14 = (ulong)((uint)bVar23 - (uint)bVar20);
              if (bVar23 == bVar20) {
                uVar14 = uVar17;
              }
              iVar8 = (int)uVar14;
              if (bVar23 != bVar20) goto joined_r0x001b4846;
              __s1 = __s1 + 1;
              pbVar12 = pbVar12 + 1;
            } while (__s1 < pbVar1);
            iVar8 = 0;
            goto joined_r0x001b4846;
          }
        }
        else {
          iVar8 = bcmp(__s1,__s2,local_218);
joined_r0x001b4846:
          if (iVar8 != 0) {
            return false;
          }
        }
        local_1e8.data_ = (const_pointer)(__s2 + local_218);
        local_1e8.size_ = uVar15;
        local_21c = (local_21c == ANCHOR_BOTH) + ANCHOR_START;
        pPVar11 = local_210;
      }
      pSVar16 = local_1f0;
      AVar9 = (Anchor)(this->options_).longest_match_;
      bVar23 = (int)uVar5 < 6 & this->is_one_pass_;
      puVar21 = (pPVar11->list_heads_).ptr_._M_t.
                super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>._M_t.
                super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>.
                super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
      uVar14 = (ulong)(int)(0x40000 / (long)pPVar11->list_count_);
      dfa_failed = false;
      if (local_21c == ANCHOR_START) {
LAB_001b48f7:
        local_21c = AVar9;
        if (((bVar23 == 1 && uVar4 < 0x1001) && (uVar4 < 9 || 1 < (int)uVar5)) ||
           ((puVar21 != (unsigned_short *)0x0 && (uVar4 <= uVar14 && 1 < (int)uVar5)))) {
          bVar6 = true;
        }
        else {
          local_210 = pPVar22;
          local_208 = uVar14;
          local_200 = puVar21;
          bVar6 = Prog::SearchDFA(pPVar11,&local_1e8,local_1f0,kAnchored,local_21c,&match,
                                  &dfa_failed,(SparseSet *)0x0);
          uVar14 = local_208;
          puVar21 = local_200;
          pPVar22 = local_210;
          if (bVar6) {
            bVar6 = false;
          }
          else {
            if (dfa_failed != true) {
              return false;
            }
            bVar6 = true;
            if ((this->options_).log_errors_ == true) {
              LogMessage::LogMessage
                        (&local_1b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                         ,0x2d7);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0.str_,"DFA out of memory: size ",0x18);
              poVar10 = (ostream *)
                        std::ostream::operator<<((ostream *)&local_1b0.str_,this->prog_->size_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"bytemap range ",0xe);
              poVar10 = (ostream *)
                        std::ostream::operator<<((ostream *)poVar10,this->prog_->bytemap_range_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"list count ",0xb);
              std::ostream::operator<<((ostream *)poVar10,this->prog_->list_count_);
              LogMessage::~LogMessage(&local_1b0);
              AVar19 = kAnchored;
              goto LAB_001b4de3;
            }
          }
        }
        AVar19 = kAnchored;
      }
      else {
        if (local_21c == ANCHOR_BOTH) {
          local_21c = kFullMatch;
          AVar9 = local_21c;
          goto LAB_001b48f7;
        }
        local_21c = AVar9;
        local_210 = pPVar22;
        local_208 = uVar14;
        local_200 = puVar21;
        bVar6 = Prog::SearchDFA(pPVar11,&local_1e8,local_1f0,kUnanchored,AVar9,local_1f8,&dfa_failed
                                ,(SparseSet *)0x0);
        pSVar16 = local_1f0;
        if (bVar6) {
          if (nsubmatch == 0) {
            return true;
          }
          pPVar11 = ReverseProg(this);
          if (pPVar11 == (Prog *)0x0) {
            bVar6 = false;
            bVar7 = false;
            pSVar16 = local_1f0;
          }
          else {
            bVar6 = Prog::SearchDFA(pPVar11,&match,local_1f0,kAnchored,kLongestMatch,&match,
                                    &dfa_failed,(SparseSet *)0x0);
            pSVar16 = local_1f0;
            if (bVar6) {
              bVar7 = true;
            }
            else {
              bVar6 = (this->options_).log_errors_;
              if (dfa_failed == true) {
                if (bVar6 != false) {
                  LogMessage::LogMessage
                            (&local_1b0,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                             ,0x2af);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1b0.str_,"DFA out of memory: size ",0x18);
                  local_1f8 = (StringPiece *)
                              std::ostream::operator<<((ostream *)&local_1b0.str_,pPVar11->size_);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,", ",2);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1f8,"bytemap range ",0xe);
                  local_1f8 = (StringPiece *)
                              std::ostream::operator<<((ostream *)local_1f8,pPVar11->bytemap_range_)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,", ",2);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1f8,"list count ",0xb);
                  std::ostream::operator<<((ostream *)local_1f8,pPVar11->list_count_);
                  LogMessage::~LogMessage(&local_1b0);
                }
                bVar6 = true;
                bVar7 = true;
                goto LAB_001b5071;
              }
              if (bVar6 == false) {
                bVar7 = false;
              }
              else {
                LogMessage::LogMessage
                          (&local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                           ,0x2b7);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1b0.str_,"SearchDFA inconsistency",0x17);
                LogMessage::~LogMessage(&local_1b0);
                bVar7 = false;
              }
            }
            bVar6 = false;
          }
LAB_001b5071:
          AVar19 = kUnanchored;
          uVar14 = local_208;
          puVar21 = local_200;
          pPVar22 = local_210;
          if (!bVar7) {
            return false;
          }
        }
        else {
          AVar19 = kUnanchored;
          if (dfa_failed != true) {
            return false;
          }
          bVar6 = true;
          uVar14 = local_208;
          puVar21 = local_200;
          pPVar22 = local_210;
          if ((this->options_).log_errors_ != true) goto LAB_001b499c;
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                     ,0x29a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,"DFA out of memory: size ",0x18);
          poVar10 = (ostream *)
                    std::ostream::operator<<((ostream *)&local_1b0.str_,this->prog_->size_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"bytemap range ",0xe);
          poVar10 = (ostream *)
                    std::ostream::operator<<((ostream *)poVar10,this->prog_->bytemap_range_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"list count ",0xb);
          std::ostream::operator<<((ostream *)poVar10,this->prog_->list_count_);
          LogMessage::~LogMessage(&local_1b0);
          AVar19 = kUnanchored;
LAB_001b4de3:
          bVar6 = true;
          uVar14 = local_208;
          puVar21 = local_200;
          pPVar22 = local_210;
        }
      }
LAB_001b499c:
      iVar8 = (int)pPVar22;
      if (iVar8 < 2 && !bVar6) {
        if (iVar8 == 1) {
          submatch->data_ = match.data_;
          submatch->size_ = match.size_;
        }
LAB_001b4e16:
        if (0 < nsubmatch && local_218 != 0) {
          submatch->data_ = submatch->data_ + -local_218;
          submatch->size_ = submatch->size_ + local_218;
        }
        if (iVar8 < nsubmatch) {
          lVar13 = (long)nsubmatch - (long)iVar8;
          pSVar16 = submatch + iVar8;
          do {
            pSVar16->data_ = (const_pointer)0x0;
            pSVar16->size_ = 0;
            pSVar16 = pSVar16 + 1;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
          return true;
        }
        return true;
      }
      local_1c8.data_ = (const_pointer)0x0;
      pSVar18 = &match;
      if (bVar6) {
        pSVar18 = &local_1e8;
      }
      anchor = kAnchored;
      if (bVar6) {
        anchor = AVar19;
      }
      AVar9 = kFullMatch;
      if (bVar6) {
        AVar9 = local_21c;
      }
      local_1c8.data_ = pSVar18->data_;
      local_1c8.size_ = pSVar18->size_;
      if (bVar23 == 1 && anchor != kUnanchored) {
        bVar7 = Prog::SearchOnePass(this->prog_,&local_1c8,pSVar16,kAnchored,AVar9,submatch,iVar8);
        if (!bVar7) {
          if (bVar6) {
            return false;
          }
          if ((this->options_).log_errors_ != true) {
            return false;
          }
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                     ,0x2f9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,"SearchOnePass inconsistency",0x1b);
          goto LAB_001b46fa;
        }
        goto LAB_001b4e16;
      }
      if ((puVar21 == (unsigned_short *)0x0) || (uVar14 < local_1c8.size_)) {
        bVar7 = Prog::SearchNFA(this->prog_,&local_1c8,pSVar16,anchor,AVar9,submatch,iVar8);
        if (bVar7) goto LAB_001b4e16;
        if (bVar6) {
          return false;
        }
        if ((this->options_).log_errors_ != true) {
          return false;
        }
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                   ,0x306);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,"SearchNFA inconsistency",0x17);
      }
      else {
        bVar7 = Prog::SearchBitState(this->prog_,&local_1c8,pSVar16,anchor,AVar9,submatch,iVar8);
        if (bVar7) goto LAB_001b4e16;
        if (bVar6) {
          return false;
        }
        if ((this->options_).log_errors_ != true) {
          return false;
        }
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                   ,0x300);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,"SearchBitState inconsistency",0x1c);
      }
      goto LAB_001b46fa;
    }
  }
  if ((this->options_).log_errors_ != true) {
    return false;
  }
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
             ,0x24a);
  poVar2 = &local_1b0.str_;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"RE2: invalid startpos, endpos pair. [",0x25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"startpos: ",10);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"endpos: ",8);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"text size: ",0xb);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
LAB_001b46fa:
  LogMessage::~LogMessage(&local_1b0);
  return false;
}

Assistant:

bool RE2::Match(const StringPiece& text,
                size_t startpos,
                size_t endpos,
                Anchor re_anchor,
                StringPiece* submatch,
                int nsubmatch) const {
  if (!ok()) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  if (startpos > endpos || endpos > text.size()) {
    if (options_.log_errors())
      LOG(ERROR) << "RE2: invalid startpos, endpos pair. ["
                 << "startpos: " << startpos << ", "
                 << "endpos: " << endpos << ", "
                 << "text size: " << text.size() << "]";
    return false;
  }

  StringPiece subtext = text;
  subtext.remove_prefix(startpos);
  subtext.remove_suffix(text.size() - endpos);

  // Use DFAs to find exact location of match, filter out non-matches.

  // Don't ask for the location if we won't use it.
  // SearchDFA can do extra optimizations in that case.
  StringPiece match;
  StringPiece* matchp = &match;
  if (nsubmatch == 0)
    matchp = NULL;

  int ncap = 1 + NumberOfCapturingGroups();
  if (ncap > nsubmatch)
    ncap = nsubmatch;

  // If the regexp is anchored explicitly, must not be in middle of text.
  if (prog_->anchor_start() && startpos != 0)
    return false;

  // If the regexp is anchored explicitly, update re_anchor
  // so that we can potentially fall into a faster case below.
  if (prog_->anchor_start() && prog_->anchor_end())
    re_anchor = ANCHOR_BOTH;
  else if (prog_->anchor_start() && re_anchor != ANCHOR_BOTH)
    re_anchor = ANCHOR_START;

  // Check for the required prefix, if any.
  size_t prefixlen = 0;
  if (!prefix_.empty()) {
    if (startpos != 0)
      return false;
    prefixlen = prefix_.size();
    if (prefixlen > subtext.size())
      return false;
    if (prefix_foldcase_) {
      if (ascii_strcasecmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    } else {
      if (memcmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    }
    subtext.remove_prefix(prefixlen);
    // If there is a required prefix, the anchor must be at least ANCHOR_START.
    if (re_anchor != ANCHOR_BOTH)
      re_anchor = ANCHOR_START;
  }

  Prog::Anchor anchor = Prog::kUnanchored;
  Prog::MatchKind kind = Prog::kFirstMatch;
  if (options_.longest_match())
    kind = Prog::kLongestMatch;
  bool skipped_test = false;

  bool can_one_pass = (is_one_pass_ && ncap <= Prog::kMaxOnePassCapture);

  // BitState allocates a bitmap of size prog_->list_count() * text.size().
  // It also allocates a stack of 3-word structures which could potentially
  // grow as large as prog_->list_count() * text.size(), but in practice is
  // much smaller.
  const int kMaxBitStateBitmapSize = 256*1024;  // bitmap size <= max (bits)
  bool can_bit_state = prog_->CanBitState();
  size_t bit_state_text_max = kMaxBitStateBitmapSize / prog_->list_count();

  bool dfa_failed = false;
  switch (re_anchor) {
    default:
    case UNANCHORED: {
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            matchp, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (options_.log_errors())
            LOG(ERROR) << "DFA out of memory: size " << prog_->size() << ", "
                       << "bytemap range " << prog_->bytemap_range() << ", "
                       << "list count " << prog_->list_count();
          // Fall back to NFA below.
          skipped_test = true;
          break;
        }
        return false;
      }
      if (matchp == NULL)  // Matched.  Don't care where
        return true;
      // SearchDFA set match[0].end() but didn't know where the
      // match started.  Run the regexp backward from match[0].end()
      // to find the longest possible match -- that's where it started.
      Prog* prog = ReverseProg();
      if (prog == NULL)
        return false;
      if (!prog->SearchDFA(match, text, Prog::kAnchored,
                           Prog::kLongestMatch, &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (options_.log_errors())
            LOG(ERROR) << "DFA out of memory: size " << prog->size() << ", "
                       << "bytemap range " << prog->bytemap_range() << ", "
                       << "list count " << prog->list_count();
          // Fall back to NFA below.
          skipped_test = true;
          break;
        }
        if (options_.log_errors())
          LOG(ERROR) << "SearchDFA inconsistency";
        return false;
      }
      break;
    }

    case ANCHOR_BOTH:
    case ANCHOR_START:
      if (re_anchor == ANCHOR_BOTH)
        kind = Prog::kFullMatch;
      anchor = Prog::kAnchored;

      // If only a small amount of text and need submatch
      // information anyway and we're going to use OnePass or BitState
      // to get it, we might as well not even bother with the DFA:
      // OnePass or BitState will be fast enough.
      // On tiny texts, OnePass outruns even the DFA, and
      // it doesn't have the shared state and occasional mutex that
      // the DFA does.
      if (can_one_pass && text.size() <= 4096 &&
          (ncap > 1 || text.size() <= 8)) {
        skipped_test = true;
        break;
      }
      if (can_bit_state && text.size() <= bit_state_text_max && ncap > 1) {
        skipped_test = true;
        break;
      }
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (options_.log_errors())
            LOG(ERROR) << "DFA out of memory: size " << prog_->size() << ", "
                       << "bytemap range " << prog_->bytemap_range() << ", "
                       << "list count " << prog_->list_count();
          // Fall back to NFA below.
          skipped_test = true;
          break;
        }
        return false;
      }
      break;
  }

  if (!skipped_test && ncap <= 1) {
    // We know exactly where it matches.  That's enough.
    if (ncap == 1)
      submatch[0] = match;
  } else {
    StringPiece subtext1;
    if (skipped_test) {
      // DFA ran out of memory or was skipped:
      // need to search in entire original text.
      subtext1 = subtext;
    } else {
      // DFA found the exact match location:
      // let NFA run an anchored, full match search
      // to find submatch locations.
      subtext1 = match;
      anchor = Prog::kAnchored;
      kind = Prog::kFullMatch;
    }

    if (can_one_pass && anchor != Prog::kUnanchored) {
      if (!prog_->SearchOnePass(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchOnePass inconsistency";
        return false;
      }
    } else if (can_bit_state && subtext1.size() <= bit_state_text_max) {
      if (!prog_->SearchBitState(subtext1, text, anchor,
                                 kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchBitState inconsistency";
        return false;
      }
    } else {
      if (!prog_->SearchNFA(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchNFA inconsistency";
        return false;
      }
    }
  }

  // Adjust overall match for required prefix that we stripped off.
  if (prefixlen > 0 && nsubmatch > 0)
    submatch[0] = StringPiece(submatch[0].data() - prefixlen,
                              submatch[0].size() + prefixlen);

  // Zero submatches that don't exist in the regexp.
  for (int i = ncap; i < nsubmatch; i++)
    submatch[i] = StringPiece();
  return true;
}